

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O0

JavascriptString * __thiscall Js::JavascriptRegExp::ToString(JavascriptRegExp *this,bool sourceOnly)

{
  char16 c_00;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  charcount_t cVar4;
  JavascriptLibrary *library;
  CompoundString *this_00;
  RegexPattern *pRVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  uint local_38;
  char16 c;
  charcount_t i;
  bool escape;
  CompoundString *builder;
  InternalString str;
  bool sourceOnly_local;
  JavascriptRegExp *this_local;
  
  str.m_content.ptr._7_1_ = sourceOnly;
  Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
  UnifiedRegex::RegexPattern::GetSource((RegexPattern *)&builder);
  cVar4 = InternalString::GetLength((InternalString *)&builder);
  library = RecyclableObject::GetLibrary((RecyclableObject *)this);
  this_00 = CompoundString::NewWithCharCapacity(cVar4 + 5,library);
  if ((str.m_content.ptr._7_1_ & 1) == 0) {
    CompoundString::AppendChars(this_00,L'/');
  }
  pRVar5 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
  bVar2 = UnifiedRegex::RegexPattern::IsLiteral(pRVar5);
  if (bVar2) {
    pcVar6 = InternalString::GetBuffer((InternalString *)&builder);
    cVar4 = InternalString::GetLength((InternalString *)&builder);
    CompoundString::AppendChars(this_00,pcVar6,cVar4);
  }
  else {
    cVar4 = InternalString::GetLength((InternalString *)&builder);
    if (cVar4 == 0) {
      CompoundString::AppendChars<5u>(this_00,(char16 (*) [5])L"(?:)",true);
    }
    else {
      bVar2 = false;
      for (local_38 = 0; cVar4 = InternalString::GetLength((InternalString *)&builder),
          local_38 < cVar4; local_38 = local_38 + 1) {
        pcVar6 = InternalString::GetBuffer((InternalString *)&builder);
        c_00 = pcVar6[local_38];
        if (bVar2) {
          bVar2 = false;
LAB_0130dcf3:
          CompoundString::AppendChars(this_00,L'\\');
          if (c_00 == L'\n') {
            CompoundString::AppendChars(this_00,L'n');
          }
          else if (c_00 == L'\r') {
            CompoundString::AppendChars(this_00,L'r');
          }
          else if (c_00 == L'\x2028') {
            CompoundString::AppendChars<6u>(this_00,(char16 (*) [6])L"u2028",true);
          }
          else if (c_00 == L'\x2029') {
            CompoundString::AppendChars<6u>(this_00,(char16 (*) [6])L"u2029",true);
          }
          else {
            CompoundString::AppendChars(this_00,c_00);
          }
        }
        else {
          if (((c_00 == L'\n') || (c_00 == L'\r')) || (c_00 == L'/')) goto LAB_0130dcf3;
          if (c_00 == L'\\') {
            bVar2 = true;
            cVar4 = InternalString::GetLength((InternalString *)&builder);
            if (cVar4 <= local_38 + 1) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                          ,0x1d2,"(i + 1 < str.GetLength())",
                                          "i + 1 < str.GetLength()");
              if (!bVar3) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar7 = 0;
            }
          }
          else {
            if (c_00 == L'\x2028' || c_00 == L'\x2029') goto LAB_0130dcf3;
            CompoundString::AppendChars(this_00,c_00);
          }
        }
      }
    }
  }
  if ((str.m_content.ptr._7_1_ & 1) == 0) {
    CompoundString::AppendChars(this_00,L'/');
    pRVar5 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
    bVar2 = UnifiedRegex::RegexPattern::IsGlobal(pRVar5);
    if (bVar2) {
      CompoundString::AppendChars(this_00,L'g');
    }
    pRVar5 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
    bVar2 = UnifiedRegex::RegexPattern::IsIgnoreCase(pRVar5);
    if (bVar2) {
      CompoundString::AppendChars(this_00,L'i');
    }
    pRVar5 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
    bVar2 = UnifiedRegex::RegexPattern::IsMultiline(pRVar5);
    if (bVar2) {
      CompoundString::AppendChars(this_00,L'm');
    }
    pRVar5 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
    bVar2 = UnifiedRegex::RegexPattern::IsDotAll(pRVar5);
    if (bVar2) {
      CompoundString::AppendChars(this_00,L's');
    }
    pRVar5 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
    bVar2 = UnifiedRegex::RegexPattern::IsUnicode(pRVar5);
    if (bVar2) {
      CompoundString::AppendChars(this_00,L'u');
    }
    pRVar5 = Memory::WriteBarrierPtr<UnifiedRegex::RegexPattern>::operator->(&this->pattern);
    bVar2 = UnifiedRegex::RegexPattern::IsSticky(pRVar5);
    if (bVar2) {
      CompoundString::AppendChars(this_00,L'y');
    }
  }
  return (JavascriptString *)this_00;
}

Assistant:

JavascriptString *JavascriptRegExp::ToString(bool sourceOnly)
    {
        Js::InternalString str = pattern->GetSource();
        CompoundString *const builder = CompoundString::NewWithCharCapacity(str.GetLength() + 5, GetLibrary());

        if (!sourceOnly)
        {
            builder->AppendChars(_u('/'));
        }
        if (pattern->IsLiteral())
        {
            builder->AppendChars(str.GetBuffer(), str.GetLength());
        }
        else
        {
            // Need to ensure that the resulting static regex is functionally equivalent (as written) to 'this' regex. This
            // involves the following:
            //   - Empty regex should result in /(?:)/ rather than //, which is a comment
            //   - Unescaped '/' needs to be escaped so that it doesn't end the static regex prematurely
            //   - Line terminators need to be escaped since they're not allowed in a static regex
            if (str.GetLength() == 0)
            {
                builder->AppendChars(_u("(?:)"));
            }
            else
            {
                bool escape = false;
                for (charcount_t i = 0; i < str.GetLength(); ++i)
                {
                    const char16 c = str.GetBuffer()[i];

                    if(!escape)
                    {
                        switch(c)
                        {
                            case _u('/'):
                            case _u('\n'):
                            case _u('\r'):
                            case _u('\x2028'):
                            case _u('\x2029'):
                                // Unescaped '/' or line terminator needs to be escaped
                                break;

                            case _u('\\'):
                                // Escape sequence; the next character is escaped and shouldn't be escaped further
                                escape = true;
                                Assert(i + 1 < str.GetLength()); // cannot end in a '\'
                                // '\' is appended on the next iteration as 'escape' is true. This handles the case where we
                                // have an escaped line terminator (\<lineTerminator>), where \\n has a different meaning and we
                                // need to use \n instead.
                                continue;

                            default:
                                builder->AppendChars(c);
                                continue;
                        }
                    }
                    else
                    {
                        escape = false;
                    }

                    builder->AppendChars(_u('\\'));
                    switch(c)
                    {
                        // Line terminators need to be escaped. \<lineTerminator> is a special case, where \\n doesn't work
                        // since that means a '\' followed by an 'n'. We need to use \n instead.
                        case _u('\n'):
                            builder->AppendChars(_u('n'));
                            break;
                        case _u('\r'):
                            builder->AppendChars(_u('r'));
                            break;
                        case _u('\x2028'):
                            builder->AppendChars(_u("u2028"));
                            break;
                        case _u('\x2029'):
                            builder->AppendChars(_u("u2029"));
                            break;

                        default:
                            builder->AppendChars(c);
                    }
                }
            }
        }

        if (!sourceOnly)
        {
            builder->AppendChars(_u('/'));

            // Cross-browser compatibility - flags are listed in alphabetical order in the spec and by other browsers
            // If you change the order of the flags, don't forget to change it in EntryGetterFlags() and GetOptions() too.
            if (pattern->IsGlobal())
            {
                builder->AppendChars(_u('g'));
            }
            if (pattern->IsIgnoreCase())
            {
                builder->AppendChars(_u('i'));
            }
            if (pattern->IsMultiline())
            {
                builder->AppendChars(_u('m'));
            }
            if (pattern->IsDotAll())
            {
                builder->AppendChars(_u('s'));
            }
            if (pattern->IsUnicode())
            {
                builder->AppendChars(_u('u'));
            }
            if (pattern->IsSticky())
            {
                builder->AppendChars(_u('y'));
            }
        }

        return builder;
    }